

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgrdma.c
# Opt level: O3

unsigned_long get_next_value(void)

{
  int iVar1;
  unsigned_long uVar2;
  unsigned_long value;
  unsigned_long local_10;
  
  iVar1 = get_next_word(&local_10);
  if (iVar1 == 0) {
    if (echo_data == '\x01') {
      printf("# 0x%08lx\n",local_10);
    }
    return local_10;
  }
  get_next_value_cold_1();
  xmlCheckVersion(0x51b1);
  uVar2 = xmlInitParser();
  return uVar2;
}

Assistant:

static unsigned long get_next_value(void)
{
	unsigned long value;

	if (get_next_word(&value)) {
		fprintf(stderr, "unexpected end of file!\n");
		exit(1);
	}

	if (echo_data)
		printf("# 0x%08lx\n", value);

	return value;
}